

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::Edition::Clear(Edition *this)

{
  Atom *pAVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->m_atoms_count;
  while (0 < iVar2) {
    this->m_atoms_count = iVar2 - 1U;
    Atom::Clear(this->m_atoms + (iVar2 - 1U));
    iVar2 = this->m_atoms_count;
  }
  pAVar1 = this->m_atoms;
  if (pAVar1 != (Atom *)0x0) {
    if (*(long *)&pAVar1[-1].m_displays_size != 0) {
      lVar3 = *(long *)&pAVar1[-1].m_displays_size * 0x30;
      do {
        Atom::~Atom((Atom *)((long)&pAVar1[-1].m_string_uid + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != 0);
    }
    operator_delete__(&pAVar1[-1].m_displays_size);
  }
  this->m_atoms = (Atom *)0x0;
  this->m_atoms_size = 0;
  return;
}

Assistant:

void Chapters::Edition::Clear() {
  while (m_atoms_count > 0) {
    Atom& a = m_atoms[--m_atoms_count];
    a.Clear();
  }

  delete[] m_atoms;
  m_atoms = NULL;

  m_atoms_size = 0;
}